

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void TrackMemberNodesInObjectForIntConstants
               (ByteCodeGenerator *byteCodeGenerator,ParseNodePtr objNode)

{
  ParseNode *this;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  ParseNodeUni *pPVar5;
  ParseNodeBin *pPVar6;
  ParseNodeStr *pPVar7;
  ParseNodePtr this_00;
  ParseNodePtr this_01;
  
  if (objNode->nop != knopObject) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2b0d,"(objNode->nop == knopObject)","objNode->nop == knopObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeUni(objNode);
  this_00 = pPVar5->pnode1;
  while( true ) {
    if (this_00 == (ParseNode *)0x0) {
      return;
    }
    OVar3 = this_00->nop;
    this_01 = this_00;
    if (OVar3 == knopList) {
      pPVar6 = ParseNode::AsParseNodeBin(this_00);
      this_01 = pPVar6->pnode1;
      OVar3 = this_01->nop;
    }
    if (OVar3 != knopEllipsis) {
      pPVar6 = ParseNode::AsParseNodeBin(this_01);
      this = pPVar6->pnode1;
      pPVar6 = ParseNode::AsParseNodeBin(this_01);
      if ((this->nop != knopComputedName) && (pPVar6->pnode2->nop == knopInt)) {
        pPVar7 = ParseNode::AsParseNodeStr(this);
        Js::ScriptContext::TrackIntConstPropertyOnGlobalUserObject
                  (byteCodeGenerator->scriptContext,pPVar7->pid->m_propertyId);
      }
    }
    if (this_00->nop != knopList) break;
    pPVar6 = ParseNode::AsParseNodeBin(this_00);
    this_00 = pPVar6->pnode2;
  }
  return;
}

Assistant:

void TrackMemberNodesInObjectForIntConstants(ByteCodeGenerator *byteCodeGenerator, ParseNodePtr objNode)
{
    Assert(objNode->nop == knopObject);

    ParseNodePtr memberList = objNode->AsParseNodeUni()->pnode1;

    while (memberList != nullptr)
    {
        ParseNodePtr memberNode = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode1 : memberList;
        if (memberNode->nop != knopEllipsis)
        {
            ParseNodePtr memberNameNode = memberNode->AsParseNodeBin()->pnode1;
            ParseNodePtr memberValNode = memberNode->AsParseNodeBin()->pnode2;

            if (memberNameNode->nop != knopComputedName && memberValNode->nop == knopInt)
            {
                Js::PropertyId propertyId = memberNameNode->AsParseNodeStr()->pid->GetPropertyId();
                TrackIntConstantsOnGlobalUserObject(byteCodeGenerator, true, propertyId);
            }
        }

        memberList = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode2 : nullptr;
    }
}